

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O3

CHog * __thiscall CHog::visualizationHalf(CHog *this,Mat *image)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  _OutputArray *in_RDX;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int cellX;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  ulong local_b0;
  _InputArray local_98;
  undefined8 local_80;
  double local_78;
  undefined8 local_70;
  CHog *local_68;
  undefined8 local_60;
  undefined4 local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined4 local_48;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"visualization",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cv::Mat::Mat((Mat *)this,*(int *)(image + 0x1c) * *(int *)(image + 0x20),
               *(int *)(image + 0x20) * *(int *)(image + 0x18),0x10);
  if ((in_RDX->super__InputArray).sz == (Size)0x0) {
    local_98.obj = &local_70;
    local_70 = 0;
    local_98.flags = -0x3efdfffa;
    local_98.sz.width = 1;
    local_98.sz.height = 1;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)this,&local_98);
  }
  else {
    local_98.sz.width = 0;
    local_98.sz.height = 0;
    local_98.flags = 0x2010000;
    local_98.obj = this;
    cv::Mat::copyTo(in_RDX);
  }
  uVar1 = *(uint *)(image + 0x1c);
  uVar6 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    local_78 = -3.4028234663852886e+38;
    lVar7 = 1;
    do {
      if (0 < *(int *)(image + 0x18)) {
        lVar13 = *(long *)(*(long *)image + lVar7 * 8);
        uVar8 = 1;
        do {
          lVar9 = (long)*(int *)(lVar13 + 0x18 + uVar8 * 0x30);
          if (0 < lVar9) {
            lVar12 = 0;
            do {
              dVar14 = *(double *)(*(long *)(lVar13 + uVar8 * 0x30) + lVar12 * 8);
              if (dVar14 <= local_78) {
                dVar14 = local_78;
              }
              local_78 = dVar14;
              lVar12 = lVar12 + 1;
            } while (lVar9 != lVar12);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != *(int *)(image + 0x18) + 1);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != uVar6 + 1);
    if (0 < (int)uVar1) {
      uVar8 = (ulong)*(uint *)(image + 0x18);
      local_b0 = 1;
      do {
        if (0 < (int)uVar8) {
          iVar4 = ((uint)(local_b0 >> 1) & 0x7fffffff) +
                  ((int)local_b0 + -1) * *(int *)(image + 0x20);
          uVar6 = 1;
          do {
            lVar7 = *(long *)(*(long *)image + local_b0 * 8);
            lVar13 = uVar6 * 0x30;
            uVar1 = *(uint *)(lVar7 + 0x18 + lVar13);
            iVar3 = *(int *)(image + 0x20);
            iVar5 = ((uint)(uVar6 >> 1) & 0x7fffffff) + ((int)uVar6 + -1) * iVar3;
            iVar11 = (int)((**(double **)(lVar7 + lVar13) / local_78) * 255.0);
            local_38 = uVar6;
            if ((long)(int)uVar1 < 1) {
              iVar10 = 0;
            }
            else {
              uVar8 = 0;
              uVar6 = 0;
              dVar14 = local_78;
              do {
                iVar3 = (int)((*(double *)
                                (*(long *)(*(long *)(*(long *)image + local_b0 * 8) + lVar13) +
                                uVar8 * 8) / dVar14) * 255.0);
                if (iVar11 < iVar3) {
                  uVar6 = uVar8 & 0xffffffff;
                  iVar11 = iVar3;
                }
                else {
                  local_60 = 0;
                  local_70 = CONCAT44(local_70._4_4_,0x3010000);
                  local_44 = *(int *)(image + 0x20) / 2;
                  local_48 = 0;
                  local_98.obj = (void *)(double)iVar3;
                  local_98.flags = 0;
                  local_98._4_4_ = 0;
                  local_80 = 0;
                  local_98.sz = (Size)local_98.obj;
                  local_68 = this;
                  local_40 = iVar5;
                  local_3c = iVar4;
                  cv::ellipse((double)((int)uVar8 * (int)(0xb4 / (ulong)uVar1)),0,0x4076800000000000
                              ,&local_70,&local_40,&local_48,&local_98,0xffffffff,8,0);
                  dVar14 = local_78;
                }
                iVar10 = (int)uVar6;
                uVar8 = uVar8 + 1;
              } while ((long)(int)uVar1 != uVar8);
              iVar3 = *(int *)(image + 0x20);
            }
            local_60 = 0;
            local_70 = CONCAT44(local_70._4_4_,0x3010000);
            local_54 = iVar3 / 2;
            local_58 = 0;
            local_98.obj = (void *)(double)iVar11;
            local_98.flags = 0;
            local_98._4_4_ = 0;
            local_80 = 0;
            local_98.sz = (Size)local_98.obj;
            local_68 = this;
            local_50 = iVar5;
            local_4c = iVar4;
            cv::ellipse((double)((int)(0xb4 / (long)(int)uVar1) * iVar10),0,0x4076800000000000,
                        &local_70,&local_50,&local_58,&local_98,0xffffffff,8,0);
            uVar6 = local_38 + 1;
            uVar8 = (ulong)*(int *)(image + 0x18);
          } while ((long)local_38 < (long)uVar8);
          uVar6 = (ulong)*(uint *)(image + 0x1c);
        }
        bVar2 = (long)local_b0 < (long)(int)uVar6;
        local_b0 = local_b0 + 1;
      } while (bVar2);
    }
  }
  return this;
}

Assistant:

cv::Mat CHog::visualizationHalf(cv::Mat image)
{
    cout<<"visualization"<<endl;
    cv::Mat visual(cellSize*numCellY, cellSize*numCellX, CV_8UC3);
    if(image.data!=NULL)
        image.copyTo(visual);
    else
        visual.setTo(0);
    double maxBinValue = -FLT_MAX;
    int pixValue;
    cv::Point start, end, center;
    int numOri, maxIdx, maxValue;
    for(int cellY = 1; cellY<numCellY+1; cellY++)
    {
        for(int cellX = 1; cellX<numCellX+1; cellX++)
        {
            numOri = hist[cellY][cellX].numOriHalf;
            for(int b = 0; b<numOri; b++)
                maxBinValue = hist[cellY][cellX].cellBinsHalf[b]>maxBinValue ? hist[cellY][cellX].cellBinsHalf[b] : maxBinValue;
        }
    }
    for(int cellY = 1; cellY<numCellY+1; cellY++)
    {
        center.y = (cellY-1) * cellSize + cellY/2;
        for(int cellX = 1; cellX<numCellX+1; cellX++)
        {
            numOri = hist[cellY][cellX].numOriHalf;
            maxIdx = 0;
            maxValue = hist[cellY][cellX].cellBinsHalf[0]/maxBinValue*255;
            center.x = (cellX-1) * cellSize + cellX/2;

            for(int b = 0; b<numOri; b++)
            {
                pixValue = hist[cellY][cellX].cellBinsHalf[b]/maxBinValue*255;
                if(pixValue>maxValue)
                {
                    maxValue = pixValue;
                    maxIdx = b;
                }
                else
                    cv::ellipse(visual, center, cv::Size(0, cellSize/2), b*(180/numOri), 0, 360, cv::Scalar(0, pixValue, pixValue), -1);
            }
            cv::ellipse(visual, center, cv::Size(0, cellSize/2), maxIdx*(180/numOri), 0, 360, cv::Scalar(0, maxValue, maxValue), -1);
            //cv::line(visual, cv::Point((cellX-1) * cellSize, 0), cv::Point((cellX-1) * cellSize, imgHeight), cv::Scalar(255,0,0));
        }
        //cv::line(visual, cv::Point(0, (cellY-1) * cellSize), cv::Point(imgWidth, (cellY-1) * cellSize), cv::Scalar(255,0,0));
    }
    return visual;
}